

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O2

void __thiscall
draco::MeshEdgebreakerTraversalDecoder::~MeshEdgebreakerTraversalDecoder
          (MeshEdgebreakerTraversalDecoder *this)

{
  std::unique_ptr<draco::RAnsBitDecoder[],_std::default_delete<draco::RAnsBitDecoder[]>_>::
  ~unique_ptr(&this->attribute_connectivity_decoders_);
  DecoderBuffer::BitDecoder::~BitDecoder(&(this->start_face_buffer_).bit_decoder_);
  RAnsBitDecoder::~RAnsBitDecoder(&this->start_face_decoder_);
  DecoderBuffer::BitDecoder::~BitDecoder(&(this->symbol_buffer_).bit_decoder_);
  DecoderBuffer::BitDecoder::~BitDecoder(&(this->buffer_).bit_decoder_);
  return;
}

Assistant:

MeshEdgebreakerTraversalDecoder()
      : attribute_connectivity_decoders_(nullptr),
        num_attribute_data_(0),
        decoder_impl_(nullptr) {}